

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::SideConnectLocId
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,int node,int side)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  
  iVar1 = pztopology::TPZTriangle::NumSides(0x19fee09);
  return (in_ESI + in_EDX) - (6 - iVar1);
}

Assistant:

int TPZCompElHDiv<TSHAPE>::SideConnectLocId(int node,int side) const {
#ifdef PZDEBUG
	if(TSHAPE::SideDimension(side)<= TSHAPE::Dimension - 2 || node >= NSideConnects(side)) {
		PZError << "TPZCompElHDiv<TSHAPE>::SideConnectLocId no connect associate " <<  endl;
		return -1;
	}
#endif

    return node+side-(TSHAPE::NSides-TSHAPE::NumSides(TSHAPE::Dimension-1)-1);
}